

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O2

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,string *broker_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  __uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
  in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> local_28;
  
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._M_head_impl =
       (helicsCLI11App *)
       in_RAX.
       super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>.
       _M_t.
       super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
       .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&this->name,broker_name);
  generateParser((BrokerApp *)&stack0xffffffffffffffd8,SUB81(this,0));
  *(CoreType *)((long)local_28._M_head_impl + 0x398) = ctype;
  *(bool *)((long)local_28._M_head_impl + 0x361) = true;
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (local_28._M_head_impl,args);
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)&stack0xffffffffffffffd8);
  }
  if ((_Head_base<0UL,_helics::helicsCLI11App_*,_false>)local_28._M_head_impl !=
      (_Head_base<0UL,_helics::helicsCLI11App_*,_false>)0x0) {
    (*((local_28._M_head_impl)->super_App)._vptr_App[1])();
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype,
                     const std::string& broker_name,
                     std::vector<std::string>& args): name(broker_name)
{
    auto app = generateParser(ctype == CoreType::MULTI);
    app->setDefaultCoreType(ctype);
    app->passConfig = true;
    if (app->helics_parse(args) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}